

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O3

void duckdb::ArraySliceFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  undefined8 *puVar1;
  char cVar2;
  char cVar3;
  LogicalTypeId LVar4;
  idx_t source_count;
  unsigned_long *puVar5;
  ulong *puVar6;
  ulong *puVar7;
  long *plVar8;
  long *plVar9;
  list_entry_t *plVar10;
  data_ptr_t pdVar11;
  data_ptr_t pdVar12;
  undefined8 uVar13;
  string_t input;
  string_t input_00;
  string_t input_01;
  string_t input_02;
  undefined1 auVar14 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  int iVar16;
  int iVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  bool bVar20;
  reference pvVar21;
  reference this;
  reference pvVar22;
  BoundFunctionExpression *pBVar23;
  pointer pFVar24;
  Vector *pVVar25;
  buffer_ptr<ValidityBuffer> *pbVar26;
  TemplatedValidityData<unsigned_long> *pTVar27;
  _Head_base<0UL,_unsigned_long_*,_false> _Var28;
  SelectionVector *pSVar29;
  element_type *peVar30;
  idx_t iVar31;
  NotImplementedException *this_00;
  ulong uVar32;
  ulong uVar33;
  anon_union_16_2_67f50693_for_value *paVar34;
  idx_t iVar35;
  undefined1 *puVar36;
  long lVar37;
  idx_t idx_in_entry;
  ulong uVar38;
  sel_t sVar39;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var40;
  ulong uVar41;
  SelectionVector *pSVar42;
  ulong uVar43;
  int64_t iVar44;
  byte bVar45;
  Allocator *pAVar46;
  uint64_t uVar47;
  bool svalid;
  bool bVar48;
  bool bVar49;
  list_entry_t lVar50;
  anon_union_16_2_67f50693_for_value aVar51;
  list_entry_t lVar52;
  anon_struct_16_3_d7536bce_for_pointer aVar53;
  string_t input_03;
  string_t input_04;
  string_t input_05;
  string_t input_06;
  list_entry_t input_07;
  idx_t *in_stack_fffffffffffffde8;
  optional_ptr<duckdb::Vector,_true> local_1f0;
  undefined1 local_1e8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d8;
  anon_union_16_2_67f50693_for_value *local_1d0;
  list_entry_t sliced;
  optional_ptr<duckdb::Vector,_true> local_1b0;
  idx_t local_1a8;
  ulong local_1a0;
  ulong local_198;
  buffer_ptr<ValidityBuffer> *local_190;
  SelectionVector sel;
  data_ptr_t local_168;
  unsigned_long *local_160;
  UnifiedVectorFormat begin_data;
  list_entry_t str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  UnifiedVectorFormat step_data;
  UnifiedVectorFormat end_data;
  
  source_count = args->count;
  pvVar21 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  VectorOperations::Copy(pvVar21,result,source_count,0,0);
  if ((result->type).id_ == SQLNULL) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    ConstantVector::SetNull(result,true);
    return;
  }
  pvVar21 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  this = vector<duckdb::Vector,_true>::operator[](&args->data,2);
  if ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start == 0x1a0) {
    pvVar22 = vector<duckdb::Vector,_true>::operator[](&args->data,3);
  }
  else {
    pvVar22 = (reference)0x0;
  }
  pBVar23 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  pFVar24 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar23->bind_info);
  cVar2 = *(char *)&pFVar24[4]._vptr_FunctionData;
  cVar3 = *(char *)((long)&pFVar24[4]._vptr_FunctionData + 1);
  bVar20 = DataChunk::AllConstant(args);
  Vector::SetVectorType(result,bVar20 * '\x02');
  LVar4 = (result->type).id_;
  if (LVar4 != VARCHAR) {
    if (LVar4 == BLOB) {
      if (pvVar22 == (reference)0x0) {
        pVVar25 = (Vector *)0x0;
      }
      else {
        pVVar25 = ListVector::GetEntry(result);
      }
      sel.sel_vector = (sel_t *)0x0;
      sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_168 = (data_ptr_t)0x0;
      if (result->vector_type == CONSTANT_VECTOR) {
        puVar5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar20 = false;
        }
        else {
          bVar20 = (*puVar5 & 1) == 0;
        }
        puVar5 = (pvVar21->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar48 = false;
        }
        else {
          bVar48 = (*puVar5 & 1) == 0;
        }
        puVar5 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar49 = false;
        }
        else {
          bVar49 = (*puVar5 & 1) == 0;
        }
        end_data.sel = (SelectionVector *)pVVar25;
        if (pvVar22 == (reference)0x0) {
          pSVar29 = (SelectionVector *)0x0;
          bVar45 = 0;
          begin_data.sel = (SelectionVector *)pvVar22;
        }
        else {
          begin_data.sel = (SelectionVector *)pvVar22;
          optional_ptr<duckdb::Vector,_true>::CheckValid
                    ((optional_ptr<duckdb::Vector,_true> *)&begin_data);
          p_Var40 = begin_data.sel[1].selection_data.internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          pSVar29 = begin_data.sel;
          if (p_Var40 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            bVar45 = 1;
          }
          else {
            bVar45 = *(byte *)&p_Var40->_vptr__Sp_counted_base & 1;
          }
        }
        if (((bVar20 || bVar48) || bVar49) || (pSVar29 != (SelectionVector *)0x0 && bVar45 == 0)) {
          ConstantVector::SetNull(result,true);
        }
        else {
          local_1d0 = (anon_union_16_2_67f50693_for_value *)result->data;
          puVar6 = (ulong *)pvVar21->data;
          puVar7 = (ulong *)this->data;
          if (pSVar29 == (SelectionVector *)0x0) {
            peVar30 = (element_type *)0x0;
          }
          else {
            optional_ptr<duckdb::Vector,_true>::CheckValid
                      ((optional_ptr<duckdb::Vector,_true> *)&begin_data);
            peVar30 = begin_data.sel[1].selection_data.internal.
                      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          }
          uVar38 = *(ulong *)local_1d0;
          str.length = (uint64_t)(local_1d0->pointer).ptr;
          str.offset._0_4_ = (int)uVar38;
          str.offset._4_4_ = (undefined4)(uVar38 >> 0x20);
          if (cVar2 == '\0') {
            step_data.sel = (SelectionVector *)*puVar6;
          }
          else {
            step_data.sel = (SelectionVector *)0x0;
          }
          if (cVar3 == '\0') {
            pSVar29 = (SelectionVector *)*puVar7;
            local_1e8 = (undefined1  [8])pSVar29;
          }
          else {
            pSVar29 = (SelectionVector *)0x0;
            local_1e8 = (undefined1  [8])(uVar38 & 0xffffffff);
          }
          bVar20 = true;
          if (peVar30 == (element_type *)0x0) {
            pAVar46 = (Allocator *)0x1;
            bVar48 = true;
LAB_01ba5853:
            ClampSlice<duckdb::string_t,long,duckdb::BlobSliceOperations>
                      ((string_t *)&str,(long *)&step_data,(long *)local_1e8);
          }
          else {
            pAVar46 = (peVar30->owned_data).allocator.ptr;
            if (((long)pAVar46 < 0) &&
               (local_1e8 = (undefined1  [8])step_data.sel, step_data.sel = pSVar29, cVar2 != '\0'))
            {
              local_1e8 = (undefined1  [8])(uVar38 & 0xffffffff);
            }
            bVar48 = pAVar46 == (Allocator *)0x1;
            if ((bVar45 | bVar48) == 1) goto LAB_01ba5853;
            bVar20 = false;
            bVar48 = false;
          }
          if ((bVar45 == 1 && pAVar46 != (Allocator *)0x1) &&
             ((long)step_data.sel < (long)local_1e8)) {
            iVar31 = CalculateSliceLength<long>
                               ((idx_t)step_data.sel,(idx_t)local_1e8,(long)pAVar46,true);
            bVar49 = true;
            SelectionVector::Initialize(&sel,iVar31);
          }
          else {
            bVar49 = false;
            iVar31 = 0;
          }
          if (bVar20) {
            input_02.value._4_1_ = str.offset._4_1_;
            input_02.value._5_1_ = str.offset._5_1_;
            input_02.value._6_1_ = str.offset._6_1_;
            input_02.value._7_1_ = str.offset._7_1_;
            input_02.value.pointer.length = (int)str.offset;
            input_02.value.pointer.ptr = (char *)str.length;
            if (bVar48) {
              input_05.value.pointer.ptr = (undefined1 *)((long)&(step_data.sel)->sel_vector + 1);
              input_05.value._0_8_ = str.length;
              aVar51.pointer =
                   (anon_struct_16_3_d7536bce_for_pointer)
                   SubstringASCII((duckdb *)result,
                                  (Vector *)CONCAT44(str.offset._4_4_,(int)str.offset),input_05,
                                  (long)local_1e8 - (long)step_data.sel,
                                  (long)local_1e8 - (long)step_data.sel);
            }
            else {
              aVar51.pointer =
                   (anon_struct_16_3_d7536bce_for_pointer)
                   BlobSliceOperations::SliceValueWithSteps
                             (result,&sel,input_02,(int64_t)step_data.sel,(int64_t)local_1e8,
                              (int64_t)pAVar46,(idx_t *)&local_168);
            }
            local_1d0->pointer = (anon_struct_16_3_d7536bce_for_pointer)aVar51;
          }
          else {
            ConstantVector::SetNull(result,true);
          }
          if (bVar49) {
            optional_ptr<duckdb::Vector,_true>::CheckValid
                      ((optional_ptr<duckdb::Vector,_true> *)&end_data);
            Vector::Slice((Vector *)end_data.sel,&sel,iVar31);
            optional_ptr<duckdb::Vector,_true>::CheckValid
                      ((optional_ptr<duckdb::Vector,_true> *)&end_data);
            Vector::Flatten((Vector *)end_data.sel,iVar31);
            ListVector::SetListSize(result,iVar31);
          }
        }
      }
      else {
        local_1f0.ptr = pvVar22;
        local_1b0.ptr = pVVar25;
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&str);
        UnifiedVectorFormat::UnifiedVectorFormat(&begin_data);
        UnifiedVectorFormat::UnifiedVectorFormat(&end_data);
        UnifiedVectorFormat::UnifiedVectorFormat(&step_data);
        Vector::ToUnifiedFormat(result,source_count,(UnifiedVectorFormat *)&str);
        Vector::ToUnifiedFormat(pvVar21,source_count,&begin_data);
        Vector::ToUnifiedFormat(this,source_count,&end_data);
        if (local_1f0.ptr != (reference)0x0) {
          optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1f0);
          Vector::ToUnifiedFormat(local_1f0.ptr,source_count,&step_data);
          iVar31 = ListVector::GetListSize(result);
          SelectionVector::Initialize(&sel,iVar31);
        }
        pdVar11 = result->data;
        FlatVector::VerifyFlatVector(result);
        if (source_count == 0) {
          local_190 = (buffer_ptr<ValidityBuffer> *)0x0;
        }
        else {
          pbVar26 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
          paVar34 = (anon_union_16_2_67f50693_for_value *)(pdVar11 + 8);
          local_190 = (buffer_ptr<ValidityBuffer> *)0x0;
          uVar38 = 0;
          do {
            uVar43 = uVar38;
            if (*(long *)CONCAT44(str.offset._4_4_,(int)str.offset) != 0) {
              uVar43 = (ulong)*(uint *)(*(long *)CONCAT44(str.offset._4_4_,(int)str.offset) +
                                       uVar38 * 4);
            }
            uVar41 = uVar38;
            if ((begin_data.sel)->sel_vector != (sel_t *)0x0) {
              uVar41 = (ulong)(begin_data.sel)->sel_vector[uVar38];
            }
            uVar33 = uVar38;
            if ((end_data.sel)->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)(end_data.sel)->sel_vector[uVar38];
            }
            if (local_1f0.ptr == (reference)0x0) {
              uVar32 = 0;
            }
            else {
              uVar32 = uVar38;
              if ((step_data.sel)->sel_vector != (sel_t *)0x0) {
                uVar32 = (ulong)(step_data.sel)->sel_vector[uVar38];
              }
            }
            if ((unsigned_long *)local_f8._M_allocated_capacity == (unsigned_long *)0x0) {
              bVar20 = false;
            }
            else {
              bVar20 = (*(ulong *)(local_f8._M_allocated_capacity + (uVar43 >> 6) * 8) >>
                        (uVar43 & 0x3f) & 1) == 0;
            }
            if (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              iVar44 = 0;
            }
            else {
              iVar44 = CONCAT71((int7)(begin_data.validity.
                                       super_TemplatedValidityMask<unsigned_long>.validity_mask
                                       [uVar41 >> 6] >> 8),
                                (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.
                                 validity_mask[uVar41 >> 6] >> (uVar41 & 0x3f) & 1) == 0);
            }
            if (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar48 = false;
            }
            else {
              bVar48 = (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [uVar33 >> 6] >> (uVar33 & 0x3f) & 1) == 0;
            }
            if (local_1f0.ptr == (reference)0x0) {
              bVar49 = false;
            }
            else if (step_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                     (unsigned_long *)0x0) {
              bVar49 = true;
            }
            else {
              bVar49 = (step_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [uVar32 >> 6] >> (uVar32 & 0x3f) & 1) != 0;
            }
            local_1d0 = paVar34;
            if (((bVar20 || (char)iVar44 != '\0') || bVar48) ||
               (local_1f0.ptr != (reference)0x0 && bVar49 == false)) {
              _Var28._M_head_impl =
                   (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (_Var28._M_head_impl == (unsigned_long *)0x0) {
                iVar31 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                sliced.offset._0_4_ = (uint)iVar31;
                sliced.offset._4_4_ = (undefined4)(iVar31 >> 0x20);
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_1e8,&sliced.offset);
                p_Var15 = p_Stack_1e0;
                auVar14 = local_1e8;
                local_1e8 = (undefined1  [8])0x0;
                p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var40 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                          validity_data.internal.
                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)auVar14;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var15;
                if ((p_Var40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var40),
                   p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
                }
                pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (pbVar26);
                _Var28._M_head_impl =
                     (pTVar27->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     _Var28._M_head_impl;
              }
              bVar45 = (byte)uVar38 & 0x3f;
              _Var28._M_head_impl[uVar38 >> 6] =
                   _Var28._M_head_impl[uVar38 >> 6] &
                   (-2L << bVar45 | 0xfffffffffffffffeU >> 0x40 - bVar45);
            }
            else {
              puVar6 = (ulong *)(str.length + uVar43 * 0x10);
              uVar43 = *puVar6;
              sliced.length = puVar6[1];
              sliced.offset._0_4_ = (uint)uVar43;
              sliced.offset._4_4_ = (undefined4)(uVar43 >> 0x20);
              if (cVar2 == '\0') {
                local_198 = *(ulong *)(begin_data.data + uVar41 * 8);
              }
              else {
                local_198 = 0;
              }
              if (cVar3 == '\0') {
                local_1a0 = *(ulong *)(end_data.data + uVar33 * 8);
                uVar41 = local_1a0;
              }
              else {
                local_1a0 = uVar43 & 0xffffffff;
                uVar41 = 0;
              }
              if (local_1f0.ptr == (reference)0x0) {
                local_1a8 = 1;
LAB_01ba43a2:
                ClampSlice<duckdb::string_t,long,duckdb::BlobSliceOperations>
                          ((string_t *)&sliced,(long *)&local_198,(long *)&local_1a0);
                bVar20 = true;
              }
              else {
                local_1a8 = *(idx_t *)(step_data.data + uVar32 * 8);
                if (((long)local_1a8 < 0) &&
                   (local_1a0 = local_198, local_198 = uVar41, cVar2 != '\0')) {
                  local_1a0 = uVar43 & 0xffffffff;
                }
                if ((~bVar49 & local_1a8 != 1) == 0) goto LAB_01ba43a2;
                bVar20 = false;
              }
              uVar41 = local_198;
              uVar43 = local_1a0;
              lVar37 = local_1a0 - local_198;
              if (lVar37 == 0 || (long)local_1a0 < (long)local_198) {
                iVar31 = 0;
              }
              else {
                iVar31 = CalculateSliceLength<long>(local_198,local_1a0,local_1a8,bVar49);
              }
              if (bVar20) {
                input.value._4_1_ = sliced.offset._4_1_;
                input.value._5_1_ = sliced.offset._5_1_;
                input.value._6_1_ = sliced.offset._6_1_;
                input.value._7_1_ = sliced.offset._7_1_;
                input.value.pointer.length = (uint)sliced.offset;
                input.value.pointer.ptr = (char *)sliced.length;
                if (local_1f0.ptr == (reference)0x0) {
                  input_03.value.pointer.ptr = (char *)(uVar41 + 1);
                  input_03.value._0_8_ = sliced.length;
                  aVar51.pointer =
                       (anon_struct_16_3_d7536bce_for_pointer)
                       SubstringASCII((duckdb *)result,
                                      (Vector *)CONCAT44(sliced.offset._4_4_,(uint)sliced.offset),
                                      input_03,lVar37,iVar44);
                }
                else {
                  aVar51.pointer =
                       (anon_struct_16_3_d7536bce_for_pointer)
                       BlobSliceOperations::SliceValueWithSteps
                                 (result,&sel,input,uVar41,uVar43,local_1a8,(idx_t *)&local_168);
                }
                *(long *)((long)local_1d0 + -8) = aVar51._0_8_;
                *(char **)local_1d0 = aVar51.pointer.ptr;
              }
              else {
                _Var28._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var28._M_head_impl == (unsigned_long *)0x0) {
                  local_160 = (unsigned_long *)
                              (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity
                  ;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_1e8,(unsigned_long *)&local_160);
                  p_Var15 = p_Stack_1e0;
                  auVar14 = local_1e8;
                  local_1e8 = (undefined1  [8])0x0;
                  p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var40 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data.internal.
                            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar14;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var15;
                  if ((p_Var40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var40),
                     p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
                  }
                  pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(pbVar26);
                  _Var28._M_head_impl =
                       (pTVar27->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var28._M_head_impl;
                }
                bVar45 = (byte)uVar38 & 0x3f;
                _Var28._M_head_impl[uVar38 >> 6] =
                     _Var28._M_head_impl[uVar38 >> 6] &
                     (-2L << bVar45 | 0xfffffffffffffffeU >> 0x40 - bVar45);
              }
              local_190 = (buffer_ptr<ValidityBuffer> *)
                          ((long)&(local_190->internal).
                                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + iVar31);
            }
            uVar38 = uVar38 + 1;
            paVar34 = local_1d0 + 1;
          } while (source_count != uVar38);
        }
        pbVar26 = local_190;
        if (local_1f0.ptr != (reference)0x0) {
          SelectionVector::SelectionVector((SelectionVector *)local_1e8,(idx_t)local_190);
          if (pbVar26 != (buffer_ptr<ValidityBuffer> *)0x0) {
            puVar36 = (undefined1 *)0x0;
            do {
              sVar39 = (sel_t)puVar36;
              if (sel.sel_vector != (sel_t *)0x0) {
                sVar39 = sel.sel_vector[(long)puVar36];
              }
              *(sel_t *)((long)&(((unsafe_unique_array<unsigned_long> *)local_1e8)->
                                super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                )._M_t.
                                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                ._M_t + (long)puVar36 * 4) = sVar39;
              puVar36 = puVar36 + 1;
            } while (pbVar26 != (buffer_ptr<ValidityBuffer> *)puVar36);
          }
          optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1b0);
          Vector::Slice(local_1b0.ptr,(SelectionVector *)local_1e8,(idx_t)pbVar26);
          optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1b0);
          Vector::Flatten(local_1b0.ptr,(idx_t)pbVar26);
          ListVector::SetListSize(result,(idx_t)pbVar26);
          if (local_1d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d8._M_pi);
          }
        }
        if (step_data.owned_sel.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (step_data.owned_sel.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (step_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (step_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (end_data.owned_sel.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (end_data.owned_sel.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (begin_data.owned_sel.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (begin_data.owned_sel.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
        }
        if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
        }
      }
      Vector::Verify(result,source_count);
      goto joined_r0x01ba5576;
    }
    if (LVar4 != LIST) {
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      str.offset = (uint64_t)&local_f8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&str,"Specifier type not implemented","");
      NotImplementedException::NotImplementedException(this_00,(string *)&str);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((result->vector_type & ~CONSTANT_VECTOR) != FLAT_VECTOR) {
      Vector::Flatten(result,source_count);
    }
    if (pvVar22 == (reference)0x0) {
      pVVar25 = (Vector *)0x0;
    }
    else {
      pVVar25 = ListVector::GetEntry(result);
    }
    sel.sel_vector = (sel_t *)0x0;
    sel.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    sel.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_168 = (data_ptr_t)0x0;
    if (result->vector_type == CONSTANT_VECTOR) {
      puVar5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar20 = false;
      }
      else {
        bVar20 = (*puVar5 & 1) == 0;
      }
      puVar5 = (pvVar21->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar48 = false;
      }
      else {
        bVar48 = (*puVar5 & 1) == 0;
      }
      puVar5 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar49 = false;
      }
      else {
        bVar49 = (*puVar5 & 1) == 0;
      }
      end_data.sel = (SelectionVector *)pVVar25;
      if (pvVar22 == (reference)0x0) {
        pSVar29 = (SelectionVector *)0x0;
        bVar45 = 0;
        begin_data.sel = (SelectionVector *)pvVar22;
      }
      else {
        begin_data.sel = (SelectionVector *)pvVar22;
        optional_ptr<duckdb::Vector,_true>::CheckValid
                  ((optional_ptr<duckdb::Vector,_true> *)&begin_data);
        p_Var40 = begin_data.sel[1].selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        pSVar29 = begin_data.sel;
        if (p_Var40 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar45 = 1;
        }
        else {
          bVar45 = *(byte *)&p_Var40->_vptr__Sp_counted_base & 1;
        }
      }
      if (((bVar20 || bVar48) || bVar49) || (pSVar29 != (SelectionVector *)0x0 && bVar45 == 0)) {
        ConstantVector::SetNull(result,true);
      }
      else {
        plVar10 = (list_entry_t *)result->data;
        pdVar11 = pvVar21->data;
        pdVar12 = this->data;
        if (pSVar29 == (SelectionVector *)0x0) {
          peVar30 = (element_type *)0x0;
        }
        else {
          optional_ptr<duckdb::Vector,_true>::CheckValid
                    ((optional_ptr<duckdb::Vector,_true> *)&begin_data);
          peVar30 = begin_data.sel[1].selection_data.internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        str.length = plVar10->length;
        str.offset._0_4_ = (int)plVar10->offset;
        str.offset._4_4_ = (undefined4)(plVar10->offset >> 0x20);
        if (cVar2 == '\0') {
          step_data.sel = *(SelectionVector **)pdVar11;
        }
        else {
          step_data.sel = (SelectionVector *)0x0;
        }
        if (cVar3 == '\0') {
          pSVar29 = *(SelectionVector **)pdVar12;
          local_1e8 = (undefined1  [8])pSVar29;
        }
        else {
          pSVar29 = (SelectionVector *)0x0;
          local_1e8 = (undefined1  [8])str.length;
        }
        bVar20 = true;
        if (peVar30 == (element_type *)0x0) {
          pAVar46 = (Allocator *)0x1;
          bVar48 = true;
LAB_01ba5922:
          ClampSlice<duckdb::list_entry_t,long,duckdb::ListSliceOperations>
                    (&str,(long *)&step_data,(long *)local_1e8);
        }
        else {
          pAVar46 = (peVar30->owned_data).allocator.ptr;
          if (((long)pAVar46 < 0) &&
             (local_1e8 = (undefined1  [8])step_data.sel, step_data.sel = pSVar29, cVar2 != '\0')) {
            local_1e8 = (undefined1  [8])str.length;
          }
          bVar48 = pAVar46 == (Allocator *)0x1;
          if ((bVar45 | bVar48) == 1) goto LAB_01ba5922;
          bVar20 = false;
          bVar48 = false;
        }
        if ((bVar45 == 1 && pAVar46 != (Allocator *)0x1) && ((long)step_data.sel < (long)local_1e8))
        {
          iVar31 = CalculateSliceLength<long>
                             ((idx_t)step_data.sel,(idx_t)local_1e8,(long)pAVar46,true);
          bVar49 = true;
          SelectionVector::Initialize(&sel,iVar31);
        }
        else {
          bVar49 = false;
          iVar31 = 0;
        }
        if (bVar20) {
          if (bVar48) {
            lVar52.length = (long)local_1e8 - (long)step_data.sel;
            lVar52.offset =
                 (long)&(step_data.sel)->sel_vector +
                 (long)&((SelectionVector *)CONCAT44(str.offset._4_4_,(int)str.offset))->sel_vector;
          }
          else {
            input_07.length = (uint64_t)step_data.sel;
            input_07.offset = str.length;
            lVar52 = ListSliceOperations::SliceValueWithSteps
                               ((ListSliceOperations *)result,(Vector *)&sel,
                                (SelectionVector *)CONCAT44(str.offset._4_4_,(int)str.offset),
                                input_07,(int64_t)local_1e8,(int64_t)pAVar46,(int64_t)&local_168,
                                in_stack_fffffffffffffde8);
          }
          *plVar10 = lVar52;
        }
        else {
          ConstantVector::SetNull(result,true);
        }
        if (bVar49) {
          optional_ptr<duckdb::Vector,_true>::CheckValid
                    ((optional_ptr<duckdb::Vector,_true> *)&end_data);
          Vector::Slice((Vector *)end_data.sel,&sel,iVar31);
          optional_ptr<duckdb::Vector,_true>::CheckValid
                    ((optional_ptr<duckdb::Vector,_true> *)&end_data);
          Vector::Flatten((Vector *)end_data.sel,iVar31);
          ListVector::SetListSize(result,iVar31);
        }
      }
    }
    else {
      local_1f0.ptr = pvVar22;
      local_1b0.ptr = pVVar25;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&str);
      UnifiedVectorFormat::UnifiedVectorFormat(&begin_data);
      UnifiedVectorFormat::UnifiedVectorFormat(&end_data);
      UnifiedVectorFormat::UnifiedVectorFormat(&step_data);
      Vector::ToUnifiedFormat(result,source_count,(UnifiedVectorFormat *)&str);
      Vector::ToUnifiedFormat(pvVar21,source_count,&begin_data);
      Vector::ToUnifiedFormat(this,source_count,&end_data);
      if (local_1f0.ptr != (reference)0x0) {
        optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1f0);
        Vector::ToUnifiedFormat(local_1f0.ptr,source_count,&step_data);
        iVar31 = ListVector::GetListSize(result);
        SelectionVector::Initialize(&sel,iVar31);
      }
      pdVar11 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (source_count == 0) {
        local_190 = (buffer_ptr<ValidityBuffer> *)0x0;
      }
      else {
        pbVar26 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        paVar34 = (anon_union_16_2_67f50693_for_value *)(pdVar11 + 8);
        local_190 = (buffer_ptr<ValidityBuffer> *)0x0;
        uVar38 = 0;
        do {
          uVar43 = uVar38;
          if (*(long *)CONCAT44(str.offset._4_4_,(int)str.offset) != 0) {
            uVar43 = (ulong)*(uint *)(*(long *)CONCAT44(str.offset._4_4_,(int)str.offset) +
                                     uVar38 * 4);
          }
          uVar41 = uVar38;
          if ((begin_data.sel)->sel_vector != (sel_t *)0x0) {
            uVar41 = (ulong)(begin_data.sel)->sel_vector[uVar38];
          }
          uVar33 = uVar38;
          if ((end_data.sel)->sel_vector != (sel_t *)0x0) {
            uVar33 = (ulong)(end_data.sel)->sel_vector[uVar38];
          }
          if (local_1f0.ptr == (reference)0x0) {
            uVar32 = 0;
          }
          else {
            uVar32 = uVar38;
            if ((step_data.sel)->sel_vector != (sel_t *)0x0) {
              uVar32 = (ulong)(step_data.sel)->sel_vector[uVar38];
            }
          }
          if ((unsigned_long *)local_f8._M_allocated_capacity == (unsigned_long *)0x0) {
            bVar20 = false;
          }
          else {
            bVar20 = (*(ulong *)(local_f8._M_allocated_capacity + (uVar43 >> 6) * 8) >>
                      (uVar43 & 0x3f) & 1) == 0;
          }
          if (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar48 = false;
          }
          else {
            bVar48 = (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar41 >> 6] >> (uVar41 & 0x3f) & 1) == 0;
          }
          if (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar33 >> 6] >> (uVar33 & 0x3f) & 1) == 0;
          }
          if (local_1f0.ptr == (reference)0x0) {
            svalid = false;
          }
          else if (step_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0) {
            svalid = true;
          }
          else {
            svalid = (step_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar32 >> 6] >> (uVar32 & 0x3f) & 1) != 0;
          }
          local_1d0 = paVar34;
          if (((bVar20 || bVar48) || bVar49) || (local_1f0.ptr != (reference)0x0 && svalid == false)
             ) {
            _Var28._M_head_impl =
                 (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (_Var28._M_head_impl == (unsigned_long *)0x0) {
              iVar31 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              sliced.offset._0_4_ = (uint)iVar31;
              sliced.offset._4_4_ = (undefined4)(iVar31 >> 0x20);
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)local_1e8,&sliced.offset);
              p_Var15 = p_Stack_1e0;
              auVar14 = local_1e8;
              local_1e8 = (undefined1  [8])0x0;
              p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var40 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                        internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)auVar14;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var15;
              if ((p_Var40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var40),
                 p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
              }
              pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (pbVar26);
              _Var28._M_head_impl =
                   (pTVar27->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var28._M_head_impl;
            }
            bVar45 = (byte)uVar38 & 0x3f;
            _Var28._M_head_impl[uVar38 >> 6] =
                 _Var28._M_head_impl[uVar38 >> 6] &
                 (-2L << bVar45 | 0xfffffffffffffffeU >> 0x40 - bVar45);
          }
          else {
            puVar1 = (undefined8 *)(str.length + uVar43 * 0x10);
            uVar13 = *puVar1;
            sliced.length = puVar1[1];
            sliced.offset._0_4_ = (uint)uVar13;
            sliced.offset._4_4_ = (undefined4)((ulong)uVar13 >> 0x20);
            if (cVar2 == '\0') {
              local_198 = *(ulong *)(begin_data.data + uVar41 * 8);
            }
            else {
              local_198 = 0;
            }
            if (cVar3 == '\0') {
              local_1a0 = *(ulong *)(end_data.data + uVar33 * 8);
              uVar47 = local_1a0;
            }
            else {
              local_1a0 = sliced.length;
              uVar47 = 0;
            }
            if (local_1f0.ptr == (reference)0x0) {
              local_1a8 = 1;
LAB_01ba4e93:
              ClampSlice<duckdb::list_entry_t,long,duckdb::ListSliceOperations>
                        (&sliced,(long *)&local_198,(long *)&local_1a0);
              bVar20 = true;
            }
            else {
              local_1a8 = *(idx_t *)(step_data.data + uVar32 * 8);
              if (((long)local_1a8 < 0) &&
                 (local_1a0 = local_198, local_198 = uVar47, cVar2 != '\0')) {
                local_1a0 = sliced.length;
              }
              if ((~svalid & local_1a8 != 1) == 0) goto LAB_01ba4e93;
              bVar20 = false;
            }
            uVar41 = local_198;
            uVar43 = local_1a0;
            lVar37 = local_1a0 - local_198;
            if (lVar37 == 0 || (long)local_1a0 < (long)local_198) {
              iVar31 = 0;
            }
            else {
              iVar31 = CalculateSliceLength<long>(local_198,local_1a0,local_1a8,svalid);
            }
            if (bVar20) {
              if (local_1f0.ptr == (reference)0x0) {
                *(ulong *)((long)local_1d0 + -8) =
                     (long)&((SelectionVector *)CONCAT44(sliced.offset._4_4_,(uint)sliced.offset))->
                            sel_vector + uVar41;
                *(long *)local_1d0 = lVar37;
              }
              else {
                lVar50.length = uVar41;
                lVar50.offset = sliced.length;
                lVar50 = ListSliceOperations::SliceValueWithSteps
                                   ((ListSliceOperations *)result,(Vector *)&sel,
                                    (SelectionVector *)
                                    CONCAT44(sliced.offset._4_4_,(uint)sliced.offset),lVar50,uVar43,
                                    local_1a8,(int64_t)&local_168,in_stack_fffffffffffffde8);
                *(uint64_t *)((long)local_1d0 + -8) = lVar50.offset;
                *(uint64_t *)local_1d0 = lVar50.length;
              }
            }
            else {
              _Var28._M_head_impl =
                   (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (_Var28._M_head_impl == (unsigned_long *)0x0) {
                local_160 = (unsigned_long *)
                            (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_1e8,(unsigned_long *)&local_160);
                p_Var15 = p_Stack_1e0;
                auVar14 = local_1e8;
                local_1e8 = (undefined1  [8])0x0;
                p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var40 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                          validity_data.internal.
                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)auVar14;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var15;
                if ((p_Var40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var40),
                   p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
                }
                pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (pbVar26);
                _Var28._M_head_impl =
                     (pTVar27->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     _Var28._M_head_impl;
              }
              bVar45 = (byte)uVar38 & 0x3f;
              _Var28._M_head_impl[uVar38 >> 6] =
                   _Var28._M_head_impl[uVar38 >> 6] &
                   (-2L << bVar45 | 0xfffffffffffffffeU >> 0x40 - bVar45);
            }
            local_190 = (buffer_ptr<ValidityBuffer> *)
                        ((long)&(local_190->internal).
                                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + iVar31);
          }
          uVar38 = uVar38 + 1;
          paVar34 = local_1d0 + 1;
        } while (source_count != uVar38);
      }
      pbVar26 = local_190;
      if (local_1f0.ptr != (reference)0x0) {
        SelectionVector::SelectionVector((SelectionVector *)local_1e8,(idx_t)local_190);
        if (pbVar26 != (buffer_ptr<ValidityBuffer> *)0x0) {
          puVar36 = (undefined1 *)0x0;
          do {
            sVar39 = (sel_t)puVar36;
            if (sel.sel_vector != (sel_t *)0x0) {
              sVar39 = sel.sel_vector[(long)puVar36];
            }
            *(sel_t *)((long)&(((unsafe_unique_array<unsigned_long> *)local_1e8)->
                              super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                              )._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t + (long)puVar36 * 4) = sVar39;
            puVar36 = puVar36 + 1;
          } while (pbVar26 != (buffer_ptr<ValidityBuffer> *)puVar36);
        }
        optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1b0);
        Vector::Slice(local_1b0.ptr,(SelectionVector *)local_1e8,(idx_t)pbVar26);
        optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1b0);
        Vector::Flatten(local_1b0.ptr,(idx_t)pbVar26);
        ListVector::SetListSize(result,(idx_t)pbVar26);
        if (local_1d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d8._M_pi);
        }
      }
      if (step_data.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (step_data.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (step_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (step_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (end_data.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (end_data.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (begin_data.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (begin_data.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
      }
      if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
      }
    }
    Vector::Verify(result,source_count);
    goto joined_r0x01ba5576;
  }
  if (pvVar22 == (reference)0x0) {
    pVVar25 = (Vector *)0x0;
  }
  else {
    pVVar25 = ListVector::GetEntry(result);
  }
  sel.sel_vector = (sel_t *)0x0;
  sel.selection_data.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  sel.selection_data.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_168 = (data_ptr_t)0x0;
  if (result->vector_type == CONSTANT_VECTOR) {
    puVar5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar5 == (unsigned_long *)0x0) {
      bVar20 = false;
    }
    else {
      bVar20 = (*puVar5 & 1) == 0;
    }
    puVar5 = (pvVar21->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar5 == (unsigned_long *)0x0) {
      bVar48 = false;
    }
    else {
      bVar48 = (*puVar5 & 1) == 0;
    }
    puVar5 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar5 == (unsigned_long *)0x0) {
      bVar49 = false;
    }
    else {
      bVar49 = (*puVar5 & 1) == 0;
    }
    step_data.sel = (SelectionVector *)pVVar25;
    end_data.sel = (SelectionVector *)pvVar22;
    if (pvVar22 == (reference)0x0) {
      pSVar29 = (SelectionVector *)0x0;
      bVar45 = 0;
    }
    else {
      optional_ptr<duckdb::Vector,_true>::CheckValid
                ((optional_ptr<duckdb::Vector,_true> *)&end_data);
      p_Var40 = end_data.sel[1].selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      pSVar29 = end_data.sel;
      if (p_Var40 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar45 = 1;
      }
      else {
        bVar45 = *(byte *)&p_Var40->_vptr__Sp_counted_base & 1;
      }
    }
    if (((bVar20 || bVar48) || bVar49) || (pSVar29 != (SelectionVector *)0x0 && bVar45 == 0)) {
      ConstantVector::SetNull(result,true);
    }
    else {
      local_1d0 = (anon_union_16_2_67f50693_for_value *)result->data;
      plVar8 = (long *)pvVar21->data;
      plVar9 = (long *)this->data;
      if (pSVar29 == (SelectionVector *)0x0) {
        peVar30 = (element_type *)0x0;
      }
      else {
        optional_ptr<duckdb::Vector,_true>::CheckValid
                  ((optional_ptr<duckdb::Vector,_true> *)&end_data);
        peVar30 = end_data.sel[1].selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      uVar18 = str.offset._4_4_;
      iVar16 = (int)str.offset;
      begin_data.sel = *(SelectionVector **)local_1d0;
      begin_data.data = (data_ptr_t)(local_1d0->pointer).ptr;
      if (cVar2 == '\0') {
        local_1e8 = (undefined1  [8])*plVar8;
      }
      else {
        local_1e8 = (undefined1  [8])0x0;
      }
      str.offset._4_4_ = (undefined4)((ulong)begin_data.sel >> 0x20);
      uVar19 = str.offset._4_4_;
      str.offset._0_4_ = (int)begin_data.sel;
      iVar17 = (int)str.offset;
      if (cVar3 == '\0') {
        pSVar29 = (SelectionVector *)*plVar9;
        pSVar42 = pSVar29;
        str.offset._0_4_ = iVar16;
        str.offset._4_4_ = uVar18;
      }
      else {
        if ((int)str.offset == 0) {
          pSVar42 = (SelectionVector *)0x0;
        }
        else {
          uVar38 = 0;
          pSVar42 = (SelectionVector *)0x0;
          do {
            pSVar42 = (SelectionVector *)
                      ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar42->sel_vector)->
                              super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                              )._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t + 1);
            uVar38 = uVar38 + 1;
          } while (((ulong)begin_data.sel & 0xffffffff) != uVar38);
        }
        pSVar29 = (SelectionVector *)0x0;
        str.length = (uint64_t)begin_data.data;
      }
      sliced.offset._0_4_ = (uint)pSVar42;
      sliced.offset._4_4_ = (undefined4)((ulong)pSVar42 >> 0x20);
      bVar20 = true;
      if (peVar30 == (element_type *)0x0) {
        pAVar46 = (Allocator *)0x1;
        bVar48 = true;
LAB_01ba5b89:
        ClampSlice<duckdb::string_t,long,duckdb::StringSliceOperations>
                  ((string_t *)&begin_data,(long *)local_1e8,(long *)&sliced);
      }
      else {
        pAVar46 = (peVar30->owned_data).allocator.ptr;
        if ((long)pAVar46 < 0) {
          if (cVar2 != '\0') {
            str.offset._0_4_ = iVar17;
            str.offset._4_4_ = uVar19;
            if (iVar17 == 0) {
              local_1e8 = (undefined1  [8])0x0;
              str.length = (uint64_t)begin_data.data;
            }
            else {
              uVar38 = 0;
              local_1e8 = (undefined1  [8])0x0;
              do {
                local_1e8 = (undefined1  [8])
                            ((long)&(((unsafe_unique_array<unsigned_long> *)
                                     &((SelectionVector *)local_1e8)->sel_vector)->
                                    super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                    )._M_t.
                                    super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                    ._M_t + 1);
                uVar38 = uVar38 + 1;
                str.length = (uint64_t)begin_data.data;
              } while (((ulong)begin_data.sel & 0xffffffff) != uVar38);
            }
          }
          sliced.offset._0_4_ = SUB84(local_1e8,0);
          sliced.offset._4_4_ = (undefined4)((ulong)local_1e8 >> 0x20);
          local_1e8 = (undefined1  [8])pSVar29;
        }
        bVar48 = pAVar46 == (Allocator *)0x1;
        if ((bVar45 | bVar48) == 1) goto LAB_01ba5b89;
        bVar20 = false;
        bVar48 = false;
      }
      if ((bVar45 == 1 && pAVar46 != (Allocator *)0x1) &&
         ((long)local_1e8 < (long)CONCAT44(sliced.offset._4_4_,(uint)sliced.offset))) {
        iVar31 = CalculateSliceLength<long>
                           ((idx_t)local_1e8,CONCAT44(sliced.offset._4_4_,(uint)sliced.offset),
                            (long)pAVar46,true);
        bVar49 = true;
        SelectionVector::Initialize(&sel,iVar31);
      }
      else {
        bVar49 = false;
        iVar31 = 0;
      }
      if (bVar20) {
        input_01.value.pointer.ptr = (char *)begin_data.data;
        input_01.value._0_8_ = begin_data.sel;
        if (bVar48) {
          lVar37 = CONCAT44(sliced.offset._4_4_,(uint)sliced.offset) - (long)local_1e8;
          input_06.value.pointer.ptr =
               (undefined1 *)
               ((long)&(((unsafe_unique_array<unsigned_long> *)local_1e8)->
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>).
                       _M_t.
                       super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t + 1);
          input_06.value._0_8_ = begin_data.data;
          aVar53 = (anon_struct_16_3_d7536bce_for_pointer)
                   SubstringUnicode((duckdb *)result,(Vector *)begin_data.sel,input_06,lVar37,lVar37
                                   );
        }
        else {
          aVar53 = (anon_struct_16_3_d7536bce_for_pointer)
                   StringSliceOperations::SliceValueWithSteps
                             (result,&sel,input_01,(int64_t)local_1e8,
                              CONCAT44(sliced.offset._4_4_,(uint)sliced.offset),(int64_t)pAVar46,
                              (idx_t *)&local_168);
        }
        local_1d0->pointer = aVar53;
      }
      else {
        ConstantVector::SetNull(result,true);
      }
      if (bVar49) {
        optional_ptr<duckdb::Vector,_true>::CheckValid
                  ((optional_ptr<duckdb::Vector,_true> *)&step_data);
        Vector::Slice((Vector *)step_data.sel,&sel,iVar31);
        optional_ptr<duckdb::Vector,_true>::CheckValid
                  ((optional_ptr<duckdb::Vector,_true> *)&step_data);
        Vector::Flatten((Vector *)step_data.sel,iVar31);
        ListVector::SetListSize(result,iVar31);
      }
    }
  }
  else {
    local_1f0.ptr = pvVar22;
    local_1b0.ptr = pVVar25;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&str);
    UnifiedVectorFormat::UnifiedVectorFormat(&begin_data);
    UnifiedVectorFormat::UnifiedVectorFormat(&end_data);
    UnifiedVectorFormat::UnifiedVectorFormat(&step_data);
    Vector::ToUnifiedFormat(result,source_count,(UnifiedVectorFormat *)&str);
    Vector::ToUnifiedFormat(pvVar21,source_count,&begin_data);
    Vector::ToUnifiedFormat(this,source_count,&end_data);
    if (local_1f0.ptr != (reference)0x0) {
      optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1f0);
      Vector::ToUnifiedFormat(local_1f0.ptr,source_count,&step_data);
      iVar31 = ListVector::GetListSize(result);
      SelectionVector::Initialize(&sel,iVar31);
    }
    pdVar11 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (source_count == 0) {
      local_1a8 = 0;
    }
    else {
      local_190 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      local_1a8 = 0;
      uVar38 = 0;
      do {
        uVar43 = uVar38;
        if (*(long *)CONCAT44(str.offset._4_4_,(int)str.offset) != 0) {
          uVar43 = (ulong)*(uint *)(*(long *)CONCAT44(str.offset._4_4_,(int)str.offset) + uVar38 * 4
                                   );
        }
        uVar41 = uVar38;
        if ((begin_data.sel)->sel_vector != (sel_t *)0x0) {
          uVar41 = (ulong)(begin_data.sel)->sel_vector[uVar38];
        }
        uVar33 = uVar38;
        if ((end_data.sel)->sel_vector != (sel_t *)0x0) {
          uVar33 = (ulong)(end_data.sel)->sel_vector[uVar38];
        }
        if (local_1f0.ptr == (reference)0x0) {
          uVar32 = 0;
        }
        else {
          uVar32 = uVar38;
          if ((step_data.sel)->sel_vector != (sel_t *)0x0) {
            uVar32 = (ulong)(step_data.sel)->sel_vector[uVar38];
          }
        }
        if ((unsigned_long *)local_f8._M_allocated_capacity == (unsigned_long *)0x0) {
          bVar20 = false;
        }
        else {
          bVar20 = (*(ulong *)(local_f8._M_allocated_capacity + (uVar43 >> 6) * 8) >>
                    (uVar43 & 0x3f) & 1) == 0;
        }
        if (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          iVar44 = 0;
        }
        else {
          iVar44 = CONCAT71((int7)(begin_data.validity.super_TemplatedValidityMask<unsigned_long>.
                                   validity_mask[uVar41 >> 6] >> 8),
                            (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.
                             validity_mask[uVar41 >> 6] >> (uVar41 & 0x3f) & 1) == 0);
        }
        if (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar48 = false;
        }
        else {
          bVar48 = (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar33 >> 6] >> (uVar33 & 0x3f) & 1) == 0;
        }
        if (local_1f0.ptr == (reference)0x0) {
          bVar49 = false;
        }
        else if (step_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                 (unsigned_long *)0x0) {
          bVar49 = true;
        }
        else {
          bVar49 = (step_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar32 >> 6] >> (uVar32 & 0x3f) & 1) != 0;
        }
        if (((bVar20 || (char)iVar44 != '\0') || bVar48) ||
           (local_1f0.ptr != (reference)0x0 && bVar49 == false)) {
          _Var28._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (_Var28._M_head_impl == (unsigned_long *)0x0) {
            iVar31 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            sliced.offset._0_4_ = (uint)iVar31;
            sliced.offset._4_4_ = (undefined4)(iVar31 >> 0x20);
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)local_1e8,&sliced.offset);
            p_Var15 = p_Stack_1e0;
            auVar14 = local_1e8;
            local_1e8 = (undefined1  [8])0x0;
            p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var40 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)auVar14;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var15;
            if ((p_Var40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var40),
               p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
            }
            pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_190);
            _Var28._M_head_impl =
                 (pTVar27->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var28._M_head_impl;
          }
          bVar45 = (byte)uVar38 & 0x3f;
          _Var28._M_head_impl[uVar38 >> 6] =
               _Var28._M_head_impl[uVar38 >> 6] &
               (-2L << bVar45 | 0xfffffffffffffffeU >> 0x40 - bVar45);
        }
        else {
          puVar6 = (ulong *)(str.length + uVar43 * 0x10);
          pSVar29 = (SelectionVector *)*puVar6;
          sliced.length = puVar6[1];
          sliced.offset._0_4_ = (uint)pSVar29;
          sliced.offset._4_4_ = (undefined4)((ulong)pSVar29 >> 0x20);
          if (cVar2 == '\0') {
            local_198 = *(ulong *)(begin_data.data + uVar41 * 8);
          }
          else {
            local_198 = 0;
          }
          if (cVar3 == '\0') {
            local_1a0 = *(ulong *)(end_data.data + uVar33 * 8);
            iVar31 = local_1a0;
          }
          else {
            p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sliced.length;
            p_Var40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sliced.length;
            if ((uint)sliced.offset < 0xd) {
              p_Var40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1e8 + 4);
            }
            if ((uint)sliced.offset == 0) {
              local_1a0 = 0;
            }
            else {
              uVar43 = 0;
              local_1a0 = 0;
              do {
                uVar41 = CONCAT71((int7)((ulong)iVar44 >> 8),
                                  *(undefined1 *)((long)&p_Var40->_vptr__Sp_counted_base + uVar43))
                         & 0xffffffffffffffc0;
                iVar44 = CONCAT71((int7)(uVar41 >> 8),-(char)uVar41);
                local_1a0 = local_1a0 + 1;
                uVar43 = uVar43 + 1;
              } while (((ulong)pSVar29 & 0xffffffff) != uVar43);
            }
            iVar31 = 0;
            local_1e8 = (undefined1  [8])pSVar29;
          }
          if (local_1f0.ptr == (reference)0x0) {
            paVar34 = (anon_union_16_2_67f50693_for_value *)&DAT_00000001;
LAB_01ba4954:
            ClampSlice<duckdb::string_t,long,duckdb::StringSliceOperations>
                      ((string_t *)&sliced,(long *)&local_198,(long *)&local_1a0);
            local_1d0 = paVar34;
            bVar20 = true;
          }
          else {
            paVar34 = *(anon_union_16_2_67f50693_for_value **)(step_data.data + uVar32 * 8);
            if ((long)paVar34 < 0) {
              if (cVar2 != '\0') {
                p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sliced.length;
                if ((uint)sliced.offset == 0) {
                  local_198 = 0;
                  local_1e8 = (undefined1  [8])pSVar29;
                }
                else {
                  uVar43 = 0;
                  local_198 = 0;
                  do {
                    local_198 = local_198 + 1;
                    uVar43 = uVar43 + 1;
                    local_1e8 = (undefined1  [8])pSVar29;
                  } while (((ulong)pSVar29 & 0xffffffff) != uVar43);
                }
              }
              local_1a0 = local_198;
              local_198 = iVar31;
            }
            if ((~bVar49 & paVar34 != (anon_union_16_2_67f50693_for_value *)&DAT_00000001) == 0)
            goto LAB_01ba4954;
            local_1d0 = paVar34;
            bVar20 = false;
          }
          uVar41 = local_198;
          uVar43 = local_1a0;
          lVar37 = local_1a0 - local_198;
          if (lVar37 == 0 || (long)local_1a0 < (long)local_198) {
            iVar31 = 0;
          }
          else {
            iVar31 = CalculateSliceLength<long>(local_198,local_1a0,(long)local_1d0,bVar49);
          }
          if (bVar20) {
            input_00.value._4_1_ = sliced.offset._4_1_;
            input_00.value._5_1_ = sliced.offset._5_1_;
            input_00.value._6_1_ = sliced.offset._6_1_;
            input_00.value._7_1_ = sliced.offset._7_1_;
            input_00.value.pointer.length = (uint)sliced.offset;
            input_00.value.pointer.ptr = (char *)sliced.length;
            if (local_1f0.ptr == (reference)0x0) {
              input_04.value.pointer.ptr = (char *)(uVar41 + 1);
              input_04.value._0_8_ = sliced.length;
              aVar51.pointer =
                   (anon_struct_16_3_d7536bce_for_pointer)
                   SubstringUnicode((duckdb *)result,
                                    (Vector *)CONCAT44(sliced.offset._4_4_,(uint)sliced.offset),
                                    input_04,lVar37,iVar44);
            }
            else {
              aVar51.pointer =
                   (anon_struct_16_3_d7536bce_for_pointer)
                   StringSliceOperations::SliceValueWithSteps
                             (result,&sel,input_00,uVar41,uVar43,(int64_t)local_1d0,
                              (idx_t *)&local_168);
            }
            *(long *)(pdVar11 + uVar38 * 0x10) = aVar51._0_8_;
            *(char **)(pdVar11 + uVar38 * 0x10 + 8) = aVar51.pointer.ptr;
          }
          else {
            _Var28._M_head_impl =
                 (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (_Var28._M_head_impl == (unsigned_long *)0x0) {
              local_160 = (unsigned_long *)
                          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)local_1e8,(unsigned_long *)&local_160);
              p_Var15 = p_Stack_1e0;
              auVar14 = local_1e8;
              local_1e8 = (undefined1  [8])0x0;
              p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var40 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                        internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)auVar14;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var15;
              if ((p_Var40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var40),
                 p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
              }
              pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_190);
              _Var28._M_head_impl =
                   (pTVar27->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var28._M_head_impl;
            }
            bVar45 = (byte)uVar38 & 0x3f;
            _Var28._M_head_impl[uVar38 >> 6] =
                 _Var28._M_head_impl[uVar38 >> 6] &
                 (-2L << bVar45 | 0xfffffffffffffffeU >> 0x40 - bVar45);
          }
          local_1a8 = local_1a8 + iVar31;
        }
        uVar38 = uVar38 + 1;
      } while (uVar38 != source_count);
    }
    iVar31 = local_1a8;
    if (local_1f0.ptr != (reference)0x0) {
      SelectionVector::SelectionVector((SelectionVector *)local_1e8,local_1a8);
      if (iVar31 != 0) {
        iVar35 = 0;
        do {
          sVar39 = (sel_t)iVar35;
          if (sel.sel_vector != (sel_t *)0x0) {
            sVar39 = sel.sel_vector[iVar35];
          }
          *(sel_t *)((long)&(((unsafe_unique_array<unsigned_long> *)local_1e8)->
                            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                            )._M_t.
                            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                            ._M_t + iVar35 * 4) = sVar39;
          iVar35 = iVar35 + 1;
        } while (iVar31 != iVar35);
      }
      optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1b0);
      Vector::Slice(local_1b0.ptr,(SelectionVector *)local_1e8,iVar31);
      optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1b0);
      Vector::Flatten(local_1b0.ptr,iVar31);
      ListVector::SetListSize(result,iVar31);
      if (local_1d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d8._M_pi);
      }
    }
    if (step_data.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (step_data.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (step_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (step_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (end_data.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (end_data.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (begin_data.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (begin_data.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
    }
    if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
    }
  }
  Vector::Verify(result,source_count);
joined_r0x01ba5576:
  if (sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

static void ArraySliceFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 3 || args.ColumnCount() == 4);
	D_ASSERT(args.data.size() == 3 || args.data.size() == 4);
	auto count = args.size();

	Vector &list_or_str_vector = result;
	// this ensures that we do not change the input chunk
	VectorOperations::Copy(args.data[0], list_or_str_vector, count, 0, 0);

	if (list_or_str_vector.GetType().id() == LogicalTypeId::SQLNULL) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, true);
		return;
	}

	Vector &begin_vector = args.data[1];
	Vector &end_vector = args.data[2];

	optional_ptr<Vector> step_vector;
	if (args.ColumnCount() == 4) {
		step_vector = &args.data[3];
	}

	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<ListSliceBindData>();
	auto begin_is_empty = info.begin_is_empty;
	auto end_is_empty = info.end_is_empty;

	result.SetVectorType(args.AllConstant() ? VectorType::CONSTANT_VECTOR : VectorType::FLAT_VECTOR);
	switch (result.GetType().id()) {
	case LogicalTypeId::LIST: {
		// Share the value dictionary as we are just going to slice it
		if (list_or_str_vector.GetVectorType() != VectorType::FLAT_VECTOR &&
		    list_or_str_vector.GetVectorType() != VectorType::CONSTANT_VECTOR) {
			list_or_str_vector.Flatten(count);
		}
		ExecuteSlice<list_entry_t, int64_t, ListSliceOperations>(result, list_or_str_vector, begin_vector, end_vector,
		                                                         step_vector, count, begin_is_empty, end_is_empty);
		break;
	}
	case LogicalTypeId::BLOB:
		ExecuteSlice<string_t, int64_t, BlobSliceOperations>(result, list_or_str_vector, begin_vector, end_vector,
		                                                     step_vector, count, begin_is_empty, end_is_empty);
		break;
	case LogicalTypeId::VARCHAR:
		ExecuteSlice<string_t, int64_t, StringSliceOperations>(result, list_or_str_vector, begin_vector, end_vector,
		                                                       step_vector, count, begin_is_empty, end_is_empty);
		break;
	default:
		throw NotImplementedException("Specifier type not implemented");
	}
}